

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Expression>_>::truncate
          (ArrayBuilder<capnp::Orphan<capnp::compiler::Expression>_> *this,char *__file,
          __off_t __length)

{
  Orphan<capnp::compiler::Expression> *pOVar1;
  RemoveConst<capnp::Orphan<capnp::compiler::Expression>_> *pRVar2;
  char *pcVar3;
  Orphan<capnp::compiler::Expression> *target;
  size_t size_local;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Expression>_> *this_local;
  
  pcVar3 = (char *)size(this);
  if (__file <= pcVar3) {
    pOVar1 = this->ptr;
    while (pOVar1 + (long)__file < this->pos) {
      pRVar2 = this->pos;
      this->pos = pRVar2 + -1;
      dtor<capnp::Orphan<capnp::compiler::Expression>>(pRVar2 + -1);
    }
    return (int)this->pos;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/array.h"
             ,0x1a3,"size <= this->size()","\"can\'t use truncate() to expand\"",
             "can\'t use truncate() to expand");
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }